

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<false,_true,_true>::fix_
          (DaTrie<false,_true,_true> *this,uint32_t node_pos,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  uint32_t *puVar1;
  pointer pBVar2;
  uint32_t uVar3;
  pointer pBVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = (ulong)node_pos;
  uVar6 = (long)(this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
                super__Vector_impl_data._M_start;
  while ((uint)(uVar6 >> 2) <= node_pos >> 8) {
    push_block_(this);
    uVar6 = (long)(this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>.
                  _M_impl.super__Vector_impl_data._M_start;
  }
  pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar5 < (ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pBVar4 >> 3)) {
    if (-1 < (long)pBVar4[uVar5]) {
      puVar1 = &this->bc_emps_;
      *puVar1 = *puVar1 - 1;
      uVar3 = *puVar1;
      pBVar2 = (blocks->super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>)._M_impl.
               super__Vector_impl_data._M_start + (node_pos >> 8);
      pBVar2->num_emps = pBVar2->num_emps - 1;
      if (uVar3 == 0) {
        this->head_pos_ = 0xffffffff;
      }
      else {
        if (this->head_pos_ == node_pos) {
          this->head_pos_ = *(uint *)(pBVar4 + this->head_pos_) & 0x7fffffff;
        }
        uVar7 = (ulong)pBVar4[uVar5] & 0x7fffffff;
        uVar6 = (ulong)pBVar4[uVar5] >> 0x20 & 0x7fffffff;
        *(int *)(pBVar4 + uVar6) = (int)uVar7;
        pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pBVar4[uVar7] = (Bc)((ulong)pBVar4[uVar7] & 0x80000000ffffffff | uVar6 << 0x20);
      }
      pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start + uVar5;
      *pBVar4 = (Bc)((ulong)*pBVar4 | 0x8000000000000000);
      return;
    }
    __assert_fail("!bc_[node_pos].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x41b,
                  "void ddd::DaTrie<false, true, true>::fix_(uint32_t, std::vector<Block> &) [WithBLM = false, WithNLM = true, Prefix = true]"
                 );
  }
  __assert_fail("node_pos < bc_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x41a,
                "void ddd::DaTrie<false, true, true>::fix_(uint32_t, std::vector<Block> &) [WithBLM = false, WithNLM = true, Prefix = true]"
               );
}

Assistant:

void fix_(uint32_t node_pos, std::vector<Block>& blocks) {
    auto block_pos = node_pos / BLOCK_SIZE;
    while (num_blocks() <= block_pos) {
      push_block_();
    }

    assert(node_pos < bc_.size());
    assert(!bc_[node_pos].is_fixed());

    --bc_emps_;
    --blocks[block_pos].num_emps;

    if (bc_emps_ == 0) {
      head_pos_ = NOT_FOUND;
    } else {
      if (node_pos == head_pos_) {
        head_pos_ = next_(head_pos_);
      }
      auto next = next_(node_pos);
      auto prev = prev_(node_pos);
      set_next_(prev, next);
      set_prev_(next, prev);
    }
    bc_[node_pos].fix();
  }